

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O3

string * __thiscall
cmFileLockResult::GetOutputMessage_abi_cxx11_(string *__return_storage_ptr__,cmFileLockResult *this)

{
  char *pcVar1;
  char *pcVar2;
  allocator<char> local_9;
  
  switch(this->Type) {
  case OK:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "0";
    pcVar1 = "";
    break;
  case SYSTEM:
    pcVar1 = strerror(this->ErrorValue);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_9);
    return __return_storage_ptr__;
  case TIMEOUT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Timeout reached";
    pcVar1 = "";
    break;
  case ALREADY_LOCKED:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "File already locked";
    pcVar1 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Internal error";
    pcVar1 = "";
    break;
  case NO_FUNCTION:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\'GUARD FUNCTION\' not used in function definition";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileLockResult::GetOutputMessage() const
{
  switch (this->Type) {
    case OK:
      return "0";
    case SYSTEM:
#if defined(_WIN32)
    {
#  define WINMSG_BUF_LEN (1024)
      char winmsg[WINMSG_BUF_LEN];
      DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS;
      if (FormatMessageA(flags, NULL, this->ErrorValue,
                         MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                         (LPSTR)winmsg, WINMSG_BUF_LEN, NULL)) {
        const std::string message = winmsg;
        return message;
      } else {
        return "Internal error (FormatMessageA failed)";
      }
    }
#else
      return strerror(this->ErrorValue);
#endif
    case TIMEOUT:
      return "Timeout reached";
    case ALREADY_LOCKED:
      return "File already locked";
    case NO_FUNCTION:
      return "'GUARD FUNCTION' not used in function definition";
    case INTERNAL:
    default:
      return "Internal error";
  }
}